

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O1

int gdAffineRotate(double *dst,double angle)

{
  double dVar1;
  double dVar2;
  undefined4 local_18;
  undefined4 uStack_14;
  
  dVar1 = (angle * 3.141592653589793) / 180.0;
  dVar2 = sin(dVar1);
  dVar1 = cos(dVar1);
  *dst = dVar1;
  local_18 = SUB84(dVar2,0);
  uStack_14 = (undefined4)((ulong)dVar2 >> 0x20);
  *(undefined4 *)(dst + 1) = local_18;
  *(undefined4 *)((long)dst + 0xc) = uStack_14;
  dst[2] = -dVar2;
  dst[3] = dVar1;
  dst[4] = 0.0;
  dst[5] = 0.0;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineRotate (double dst[6], const double angle)
{
	const double sin_t = sin (angle * M_PI / 180.0);
	const double cos_t = cos (angle * M_PI / 180.0);

	dst[0] = cos_t;
	dst[1] = sin_t;
	dst[2] = -sin_t;
	dst[3] = cos_t;
	dst[4] = 0;
	dst[5] = 0;
	return GD_TRUE;
}